

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,void>
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *container,
               ostream *os)

{
  bool bVar1;
  reference value;
  pair<int,_int> *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0;
  __end0 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(container)
  ;
  elem = (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(container);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)&elem);
    if (!bVar1) {
LAB_001b4db5:
      if (__range3 != (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = __gnu_cxx::
            __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::operator*(&__end0);
    if ((__range3 != (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0) &&
       (std::operator<<(os,','),
       __range3 == (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_001b4db5;
    }
    std::operator<<(os,' ');
    UniversalPrint<std::pair<int,int>>(value,os);
    __range3 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               ((long)&(__range3->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }